

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractByteBuffer.cpp
# Opt level: O3

bufsize_t __thiscall BufferView::getContentSize(BufferView *this)

{
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  bufsize_t bVar4;
  ulong uVar3;
  
  iVar2 = (*this->parent->_vptr_AbstractByteBuffer[2])();
  uVar3 = CONCAT44(extraout_var,iVar2);
  uVar1 = this->offset;
  if (uVar3 < uVar1) {
    bVar4 = 0;
  }
  else {
    bVar4 = uVar3 - uVar1;
    if (uVar1 + this->size <= uVar3) {
      bVar4 = this->size;
    }
  }
  return bVar4;
}

Assistant:

bufsize_t BufferView::getContentSize()
{
    bufsize_t maxSize = this->parent->getContentSize();
    if (offset > maxSize) {
        return 0;
    }
    if (offset + size > maxSize) {
        bufsize_t trimedSize = maxSize - offset;
        return trimedSize;
    }
    return size;
}